

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

void __thiscall
Future<void>::Private::ThreadPool::run(ThreadPool *this,_func_void_void_ptr *proc,void *args)

{
  LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this_00;
  usize *puVar1;
  ulong uVar2;
  Item *pIVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ThreadContext *obj;
  Job *__stat_loc;
  Guard guard;
  Job job_1;
  Job job;
  
  this_00 = &this->_queue;
  job.proc = proc;
  job.args = args;
  while (bVar4 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(this_00,&job), !bVar4)
  {
    FastSignal::reset(&this->_dequeuedSignal);
    __stat_loc = &job;
    bVar4 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(this_00,&job);
    if (bVar4) break;
    FastSignal::wait(&this->_dequeuedSignal,__stat_loc);
  }
  FastSignal::set(&this->_enqueuedSignal);
  LOCK();
  puVar1 = &this->_pushedJobs;
  uVar7 = *puVar1;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  uVar2 = this->_threadCount;
  lVar6 = ~uVar7 + this->_processedJobs + uVar2;
  if (lVar6 == 1) {
    uVar7 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar7 >> 10);
  }
  else if (lVar6 < 1) {
    uVar7 = Time::ticks();
    this->_idleResetTime = (uint32)(uVar7 >> 10);
    if (uVar2 < this->_maxThreads) {
      job_1.proc = (_func_void_void_ptr *)&this->_mutex;
      Mutex::lock((Mutex *)job_1.proc);
      guard._mutex = (Mutex *)(this->_threads)._begin.item;
      pIVar3 = (this->_threads)._end.item;
      while ((Item *)guard._mutex != pIVar3) {
        if (*(char *)&((Item *)((long)guard._mutex + 0x30))->prev == '\x01') {
          iVar5 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                            (&this->_threads,(char *)&guard);
          guard._mutex = (Mutex *)CONCAT44(extraout_var_00,iVar5);
        }
        else {
          guard._mutex = (Mutex *)((Item *)guard._mutex)->next;
        }
      }
      if (this->_threadCount < this->_maxThreads) {
        this->_threadCount = this->_threadCount + 1;
        obj = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append(&this->_threads);
      }
      else {
        obj = (ThreadContext *)0x0;
      }
      Mutex::Guard::~Guard((Guard *)&job_1);
      if (obj != (ThreadContext *)0x0) {
        obj->_pool = this;
        bVar4 = Thread::start<Future<void>::Private::ThreadPool::ThreadContext>
                          (&obj->_thread,obj,0x10bfb4);
        if (!bVar4) {
          obj->_terminated = true;
        }
      }
    }
  }
  else if ((this->_minThreads < uVar2) &&
          (uVar7 = Time::ticks(), 1 < (int)(uVar7 >> 10) - this->_idleResetTime)) {
    guard._mutex = &this->_mutex;
    Mutex::lock(guard._mutex);
    if (this->_minThreads < this->_threadCount) {
      job_1.proc = (_func_void_void_ptr *)0x0;
      job_1.args = (void *)0x0;
      bVar4 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push(this_00,&job_1);
      if (bVar4) {
        this->_threadCount = this->_threadCount - 1;
      }
    }
    job_1.proc = (_func_void_void_ptr *)(this->_threads)._begin.item;
    pIVar3 = (this->_threads)._end.item;
    while ((Item *)job_1.proc != pIVar3) {
      if (*(char *)&((Item *)((long)job_1.proc + 0x30))->prev == '\x01') {
        iVar5 = PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
                          (&this->_threads,(char *)&job_1);
        job_1.proc = (_func_void_void_ptr *)CONCAT44(extraout_var,iVar5);
      }
      else {
        job_1.proc = (_func_void_void_ptr *)((Item *)job_1.proc)->next;
      }
    }
    Mutex::Guard::~Guard(&guard);
  }
  return;
}

Assistant:

void run(void (*proc)(void *), void *args)
    {
      Job job = {proc, args};
      while (!_queue.push(job))
      {
        _dequeuedSignal.reset();
        if (_queue.push(job))
          break;
        _dequeuedSignal.wait();
      }
      _enqueuedSignal.set();

      // adjust worker thread count
      usize pushedJobs = Atomic::increment(_pushedJobs);
      ssize busyThreads = (ssize)(pushedJobs - _processedJobs);
      usize threadCount = _threadCount;
      ssize idleThreads = (ssize)threadCount - busyThreads;
      if (idleThreads == 1)
        _idleResetTime = (uint32)(Time::ticks() >> 10);
      else
      {
        if (idleThreads <= 0)
        { // start new worker thread
          _idleResetTime = (uint32)(Time::ticks() >> 10);
          if (threadCount < _maxThreads)
          {
            ThreadContext *context = 0;
            {
              Mutex::Guard guard(_mutex);
              for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
              {
                if (i->_terminated)
                  i = _threads.remove(i);
                else
                  ++i;
              }
              if (_threadCount < _maxThreads)
              {
                ++_threadCount;
                context = &_threads.append();
              }
            }
            if (context)
            {
              context->_pool = this;
              if (!context->_thread.start(*context, &ThreadContext::proc))
                context->_terminated = true;
            }
          }
        }
        else if (idleThreads > 1 && threadCount > _minThreads && (uint32)(Time::ticks() >> 10) - _idleResetTime > 1)
        { // terminate a worker thread
          Mutex::Guard guard(_mutex);
          if (_threadCount > _minThreads)
          {
            Job job = {0, 0};
            if (_queue.push(job))
              --_threadCount;
          }
          for (PoolList<ThreadContext>::Iterator i = _threads.begin(), end = _threads.end(); i != end;)
          {
            if (i->_terminated)
              i = _threads.remove(i);
            else
              ++i;
          }
        }
      }
    }